

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  TValue *pTVar2;
  Table *local_88;
  Table *local_80;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  TValue *oldval;
  Table *h;
  TValue *tm;
  TValue temp;
  int loop;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  temp._12_4_ = 0;
  key_local = t;
  do {
    if (99 < (int)temp._12_4_) {
      luaG_runerror(L,"loop in settable");
      return;
    }
    if (key_local->tt == 5) {
      t_00 = (key_local->value).gc;
      pTVar2 = luaH_set(L,&t_00->h,key);
      if (pTVar2->tt != 0) {
LAB_00109cfe:
        pTVar2->value = val->value;
        pTVar2->tt = val->tt;
        (t_00->h).flags = '\0';
        if (val->tt < 4) {
          return;
        }
        if (((((val->value).gc)->gch).marked & 3) == 0) {
          return;
        }
        if (((t_00->gch).marked & 4) == 0) {
          return;
        }
        luaC_barrierback(L,&t_00->h);
        return;
      }
      if ((t_00->h).metatable == (Table *)0x0) {
        local_80 = (Table *)0x0;
      }
      else {
        if ((((t_00->h).metatable)->flags & 2) == 0) {
          local_88 = (Table *)luaT_gettm((t_00->h).metatable,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        else {
          local_88 = (Table *)0x0;
        }
        local_80 = local_88;
      }
      h = local_80;
      if (local_80 == (Table *)0x0) goto LAB_00109cfe;
    }
    else {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if (*(int *)&h->tt == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    iVar1._0_1_ = h->tt;
    iVar1._1_1_ = h->marked;
    iVar1._2_1_ = h->flags;
    iVar1._3_1_ = h->lsizenode;
    if (iVar1 == 6) {
      callTM(L,(TValue *)h,key_local,key,val);
      return;
    }
    tm = (TValue *)&h->next->gch;
    temp.value._0_1_ = h->tt;
    temp.value._1_1_ = h->marked;
    temp.value._2_1_ = h->flags;
    temp.value._3_1_ = h->lsizenode;
    key_local = (TValue *)&tm;
    temp._12_4_ = temp._12_4_ + 1;
  } while( true );
}

Assistant:

static void luaV_settable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
TValue temp;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
TValue*oldval=luaH_set(L,h,key);
if(!ttisnil(oldval)||
(tm=fasttm(L,h->metatable,TM_NEWINDEX))==NULL){
setobj(L,oldval,val);
h->flags=0;
luaC_barriert(L,h,val);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_NEWINDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTM(L,tm,t,key,val);
return;
}
setobj(L,&temp,tm);
t=&temp;
}
luaG_runerror(L,"loop in settable");
}